

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_Torus.cpp
# Opt level: O2

void __thiscall sch::STP_Torus::STP_Torus(STP_Torus *this,STP_Torus *t)

{
  (this->super_STP_Feature).m_nextBVPrime = (t->super_STP_Feature).m_nextBVPrime;
  (this->super_STP_Feature)._vptr_STP_Feature = (_func_int **)&PTR__STP_Torus_001d65a0;
  s_STP_Circle::s_STP_Circle
            (&this->m_circle,&(t->m_circle).m_normal,&(t->m_circle).m_center,(t->m_circle).m_radius)
  ;
  this->m_sphereRadius = t->m_sphereRadius;
  s_STP_VVR::s_STP_VVR(&this->m_VVR0);
  s_STP_VVR::s_STP_VVR(&this->m_VVR1);
  s_STP_VVR::s_STP_VVR(&this->m_VVR2);
  s_STP_VVR::s_STP_VVR(&this->m_VVR3);
  s_STP_VVR::operator=(&this->m_VVR0,&t->m_VVR0);
  s_STP_VVR::operator=(&this->m_VVR1,&t->m_VVR1);
  s_STP_VVR::operator=(&this->m_VVR2,&t->m_VVR2);
  s_STP_VVR::operator=(&this->m_VVR3,&t->m_VVR3);
  return;
}

Assistant:

STP_Torus::STP_Torus(const STP_Torus & t)
: STP_Feature(t), m_circle(t.m_circle.m_normal, t.m_circle.m_center, t.m_circle.m_radius),
  m_sphereRadius(t.m_sphereRadius)
{
  m_VVR0 = t.m_VVR0;
  m_VVR1 = t.m_VVR1;
  m_VVR2 = t.m_VVR2;
  m_VVR3 = t.m_VVR3;
}